

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,float delta)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  
  lVar8 = (long)k;
  lVar7 = *(long *)(this + 0x78);
  fVar1 = *(float *)(lVar7 + lVar8 * 4);
  fVar2 = kappa / (1.0 - kappa) + delta;
  if (selected < 0) {
    *(float *)(lVar7 + lVar8 * 4) = fVar1 + **(float **)(this + 0x60) * 0.5;
    if (r_size != 0) {
      lVar7 = 0;
      do {
        iVar5 = *(int *)(*(long *)(this + 0x60) + 4 + lVar7);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar5].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
             *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar2;
        fVar11 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                             *)this,it[iVar5].column,x);
        if (fVar11 <= 0.0) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               (fVar11 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4)) - fVar2;
        }
        lVar7 = lVar7 + 0xc;
      } while ((ulong)(uint)r_size * 0xc != lVar7);
    }
  }
  else {
    uVar6 = selected + 1;
    fVar11 = *(float *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0xc);
    if ((int)uVar6 < r_size) {
      *(float *)(lVar7 + lVar8 * 4) =
           fVar1 + (fVar11 + *(float *)(*(long *)(this + 0x60) + (ulong)uVar6 * 0xc)) * 0.5;
      lVar7 = 4;
      uVar10 = 0;
      do {
        iVar5 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar5].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
             fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4);
        fVar11 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                             *)this,it[iVar5].column,x);
        if (0.0 <= fVar11) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               (*(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar11) + fVar2;
        }
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar6 != uVar10);
      if (r_size != (int)uVar10) {
        lVar9 = (uint)r_size - uVar10;
        do {
          iVar5 = *(int *)(*(long *)(this + 0x60) + lVar7);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar5].column);
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar2;
          fVar11 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                               *)this,it[iVar5].column,x);
          if (fVar11 <= 0.0) {
            *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
                 (fVar11 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4)) - fVar2;
          }
          lVar7 = lVar7 + 0xc;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
    }
    else {
      auVar3 = vfmadd132ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar1),ZEXT416(0x3fc00000));
      *(int *)(lVar7 + lVar8 * 4) = auVar3._0_4_;
      if (r_size != 0) {
        lVar7 = 0;
        do {
          iVar5 = *(int *)(*(long *)(this + 0x60) + 4 + lVar7);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar5].column);
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4);
          fVar11 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                               *)this,it[iVar5].column,x);
          if (0.0 <= fVar11) {
            *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
                 (*(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar11) + fVar2;
          }
          lVar7 = lVar7 + 0xc;
        } while ((ulong)(uint)r_size * 0xc != lVar7);
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                      *)this,k,x);
  if (!bVar4) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  iVar5 = vmovmskps_avx(ZEXT416((uint)fVar1));
  return (bool)((byte)((byte)((uint)(iVar5 << 0x1f) >> 0x18) ^
                      (byte)((uint)*(undefined4 *)(*(long *)(this + 0x78) + lVar8 * 4) >> 0x18)) >>
               7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }